

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrumTAP.cpp
# Opt level: O0

void __thiscall Storage::Tape::ZXSpectrumTAP::ZXSpectrumTAP(ZXSpectrumTAP *this,string *file_name)

{
  bool bVar1;
  uint16_t uVar2;
  undefined4 *puVar3;
  long lVar4;
  stat *psVar5;
  uint16_t block_length;
  string *file_name_local;
  ZXSpectrumTAP *this_local;
  
  Tape::Tape(&this->super_Tape);
  (this->super_Tape)._vptr_Tape = (_func_int **)&PTR_is_at_end_00cab6b8;
  FileHolder::FileHolder(&this->file_,file_name,ReadWrite);
  this->block_length_ = 0;
  this->block_type_ = '\0';
  this->data_byte_ = '\0';
  this->phase_ = PilotTone;
  this->distance_into_phase_ = 0;
  do {
    uVar2 = FileHolder::get16le(&this->file_);
    bVar1 = FileHolder::eof(&this->file_);
    if (bVar1) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0;
      __cxa_throw(puVar3,&{unnamed_type#1}::typeinfo,0);
    }
    FileHolder::seek(&this->file_,(ulong)uVar2,1);
    lVar4 = FileHolder::tell(&this->file_);
    psVar5 = FileHolder::stats(&this->file_);
  } while (lVar4 != psVar5->st_size);
  (*(this->super_Tape)._vptr_Tape[8])();
  return;
}

Assistant:

ZXSpectrumTAP::ZXSpectrumTAP(const std::string &file_name) :
	file_(file_name)
{
	// Check for a continuous series of blocks through to
	// exactly file end.
	//
	// To consider: could also check those blocks of type 0
	// and type ff for valid checksums?
	while(true) {
		const uint16_t block_length = file_.get16le();
		if(file_.eof()) throw ErrorNotZXSpectrumTAP;

		file_.seek(block_length, SEEK_CUR);
		if(file_.tell() == file_.stats().st_size) break;
	}

	virtual_reset();
}